

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_SubDVertex::TopologyHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDVertex *this,
          bool bIncludeSubdivisionProperties)

{
  double dVar1;
  ON_SHA1_Hash *pOVar2;
  bool bVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  uint i;
  ON_SubDEdgePtr eptr;
  ON_SubDEdgeSharpness s;
  ON_SHA1 sha1;
  ON_SubDEdgePtr local_d0;
  ON_SHA1_Hash *local_c8;
  ON_SubDEdgeSharpness local_c0;
  ON_SHA1 local_b8;
  
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  local_c8 = __return_storage_ptr__;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  ON_SHA1::AccumulateInteger32(&local_b8,(this->super_ON_SubDComponentBase).m_id);
  if ((int)CONCAT71(in_register_00000011,bIncludeSubdivisionProperties) != 0) {
    ON_SHA1::AccumulateBytes(&local_b8,&this->m_vertex_tag,1);
    ON_SHA1::AccumulateDoubleArray(&local_b8,3,this->m_P);
  }
  bVar3 = IsCreaseOrCorner(this);
  if (this->m_edges != (ON_SubDEdgePtr *)0x0) {
    ON_SHA1::AccumulateInteger16(&local_b8,this->m_edge_count);
    if (this->m_edge_count != 0) {
      uVar4 = 0;
      do {
        local_d0.m_ptr = this->m_edges[uVar4].m_ptr;
        if ((local_d0.m_ptr & 0xfffffffffffffff8) == 0) {
          ON_SHA1::AccumulateInteger32(&local_b8,-1);
        }
        else {
          ON_SHA1::AccumulateInteger32
                    (&local_b8,*(ON__INT32 *)((local_d0.m_ptr & 0xfffffffffffffff8) + 8));
          ON_SHA1::AccumulateInteger32(&local_b8,(uint)local_d0.m_ptr & 1);
          if ((~bVar3 & bIncludeSubdivisionProperties) != 0) {
            local_c0 = ON_SubDEdgePtr::RelativeSharpness(&local_d0,true);
            dVar1 = ON_SubDEdgeSharpness::operator[](&local_c0,0);
            ON_SHA1::AccumulateDouble(&local_b8,dVar1);
            dVar1 = ON_SubDEdgeSharpness::operator[](&local_c0,1);
            ON_SHA1::AccumulateDouble(&local_b8,dVar1);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_edge_count);
    }
  }
  if (this->m_faces != (ON_SubDFace **)0x0) {
    ON_SHA1::AccumulateInteger16(&local_b8,this->m_face_count);
    if (this->m_face_count != 0) {
      uVar4 = 0;
      do {
        if (this->m_faces[uVar4] == (ON_SubDFace *)0x0) {
          i = 0xffffffff;
        }
        else {
          i = (this->m_faces[uVar4]->super_ON_SubDComponentBase).m_id;
        }
        ON_SHA1::AccumulateInteger32(&local_b8,i);
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_face_count);
    }
  }
  pOVar2 = local_c8;
  ON_SHA1::Hash(local_c8,&local_b8);
  return pOVar2;
}

Assistant:

const ON_SHA1_Hash ON_SubDVertex::TopologyHash(bool bIncludeSubdivisionProperties) const
{
  ON_SHA1 sha1;
  sha1.AccumulateInteger32(m_id);
  if (bIncludeSubdivisionProperties)
  {
    sha1.AccumulateBytes(&this->m_vertex_tag, sizeof(this->m_vertex_tag));
    sha1.AccumulateDoubleArray(3, this->m_P);
  }

  if (this->IsCreaseOrCorner())
    bIncludeSubdivisionProperties = false;

  if (nullptr != this->m_edges)
  {
    sha1.AccumulateInteger16(m_edge_count);
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdgePtr eptr = this->m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
      {
        sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
      }
      else
      {
        sha1.AccumulateInteger32(e->m_id);
        sha1.AccumulateInteger32((ON__UINT32)ON_SUBD_EDGE_DIRECTION(eptr.m_ptr));
        if (bIncludeSubdivisionProperties)
        {
          // passing true here includes the edge tag in the hash.
          const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(true);
          sha1.AccumulateDouble(s[0]);
          sha1.AccumulateDouble(s[1]);
        }
      }
    }
  }

  if (nullptr != this->m_faces)
  {
    sha1.AccumulateInteger16(m_face_count);
    for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
    {
      const ON_SubDFace* f = this->m_faces[vfi];
      sha1.AccumulateInteger32(nullptr == f ? ON_UNSET_UINT_INDEX : f->m_id);
    }
  }

  return sha1.Hash();
}